

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O1

void __thiscall
pstore::region::region_builder<pstore::file::in_memory,_pstore::in_memory_mapper>::push
          (region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> *this,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t param_2,uint64_t offset,uint64_t size)

{
  in_memory *__args;
  bool local_42;
  undefined1 local_41;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  uint64_t local_30;
  uint64_t local_28;
  shared_ptr<pstore::memory_mapper_base> local_20;
  
  local_30 = size;
  local_28 = offset;
  if (regions.ptr_ ==
      (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
       *)0x0) {
    assert_failed("regions != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                  ,0xa1);
  }
  if (this->minimum_size_ <= size) {
    __args = (this->file_).super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_42 = __args->writable_;
    local_40 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pstore::in_memory_mapper,std::allocator<pstore::in_memory_mapper>,pstore::file::in_memory&,bool,unsigned_long&,unsigned_long&>
              (&_Stack_38,(in_memory_mapper **)&local_40,
               (allocator<pstore::in_memory_mapper> *)&local_41,__args,&local_42,&local_28,&local_30
              );
    local_20.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_40;
    local_20.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_38._M_pi;
    local_40 = (element_type *)0x0;
    _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    vector<std::shared_ptr<pstore::memory_mapper_base>,std::allocator<std::shared_ptr<pstore::memory_mapper_base>>>
    ::emplace_back<std::shared_ptr<pstore::memory_mapper_base>>
              ((vector<std::shared_ptr<pstore::memory_mapper_base>,std::allocator<std::shared_ptr<pstore::memory_mapper_base>>>
                *)regions.ptr_,&local_20);
    if (local_20.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
    }
    return;
  }
  assert_failed("size >= minimum_size_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                ,0xa2);
}

Assistant:

void
        region_builder<File, MemoryMapper>::push (gsl::not_null<container_type *> const regions,
                                                  std::uint64_t const /*file_size*/,
                                                  std::uint64_t offset, std::uint64_t size) {
            PSTORE_ASSERT (regions != nullptr);
            PSTORE_ASSERT (size >= minimum_size_);
            // (Note that we separately make pages read-only to guard against writing to committed
            // transactions: that's done by database::protect() rather than here.)
            regions->push_back (
                std::make_shared<MemoryMapper> (*file_, file_->is_writable (), offset, size));
        }